

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeCommandQueueCreatePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_command_queue_desc_t *desc,ze_command_queue_handle_t *phCommandQueue)

{
  pointer p_Var1;
  ze_result_t zVar2;
  initializer_list<_ze_structure_type_t> __l;
  vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_> baseTypes;
  allocator_type local_2d;
  _ze_structure_type_t local_2c;
  vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_> local_28;
  
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if ((((hDevice != (ze_device_handle_t)0x0 && hContext != (ze_context_handle_t)0x0) &&
       (zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER,
       phCommandQueue != (ze_command_queue_handle_t *)0x0 && desc != (ze_command_queue_desc_t *)0x0)
       ) && (zVar2 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->flags < 4)) &&
     (((int)desc->mode < 3 && ((int)desc->priority < 3)))) {
    local_2c = ZE_STRUCTURE_TYPE_COMMAND_QUEUE_DESC;
    __l._M_len = 1;
    __l._M_array = &local_2c;
    std::vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>::vector
              (&local_28,__l,&local_2d);
    zVar2 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
    if (local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      p_Var1 = local_28.
               super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (desc->stype == *p_Var1) {
          if (((int *)desc->pNext == (int *)0x0) || (*desc->pNext < 0x100000)) {
            zVar2 = ZE_RESULT_SUCCESS;
          }
          break;
        }
        p_Var1 = p_Var1 + 1;
      } while (p_Var1 != local_28.
                         super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (ze_structure_type_t *)0x0) {
      operator_delete(local_28.
                      super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeCommandQueueCreatePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_queue_desc_t* desc,            ///< [in] pointer to command queue descriptor
        ze_command_queue_handle_t* phCommandQueue       ///< [out] pointer to handle of command queue object created
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phCommandQueue )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x3 < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_COMMAND_QUEUE_MODE_ASYNCHRONOUS < desc->mode )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_HIGH < desc->priority )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }